

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

void __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::parseCurrentNode
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  
  pcVar4 = this->P;
  lVar5 = 0;
  while( true ) {
    if (pcVar4[lVar5] == '\0') {
      return;
    }
    if (pcVar4[lVar5] == '<') break;
    this->P = pcVar4 + lVar5 + 1;
    lVar5 = lVar5 + 1;
  }
  if ((0 < lVar5) && (bVar3 = setText(this,pcVar4,pcVar4 + lVar5), bVar3)) {
    return;
  }
  pcVar4 = this->P;
  this->P = pcVar4 + 1;
  cVar1 = pcVar4[1];
  if (cVar1 == '!') {
    bVar3 = parseCDATA(this);
    if (bVar3) {
      return;
    }
    parseComment(this);
    return;
  }
  if (cVar1 == '?') {
    this->CurrentNodeType = EXN_UNKNOWN;
    if (pcVar4[1] != '>') {
      pcVar2 = pcVar4 + 2;
      do {
        pcVar4 = pcVar2;
        this->P = pcVar4;
        pcVar2 = pcVar4 + 1;
      } while (*pcVar4 != '>');
      pcVar4 = pcVar4 + -1;
    }
    this->P = pcVar4 + 2;
    return;
  }
  if (cVar1 != '/') {
    parseOpeningXMLElement(this);
    return;
  }
  parseClosingXMLElement(this);
  return;
}

Assistant:

void parseCurrentNode()
	{
		char_type* start = P;

		// move forward until '<' found
		while(*P != L'<' && *P)
			++P;

		if (!*P)
			return;

		if (P - start > 0)
		{
			// we found some text, store it
			if (setText(start, P))
				return;
		}

		++P;

		// based on current token, parse and report next element
		switch(*P)
		{
		case L'/':
			parseClosingXMLElement(); 
			break;
		case L'?':
			ignoreDefinition();	
			break;
		case L'!':
			if (!parseCDATA())
				parseComment();	
			break;
		default:
			parseOpeningXMLElement();
			break;
		}
	}